

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# role.c
# Opt level: O3

int str2role(char *str)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  Role *pRVar5;
  ulong uVar6;
  size_t __n;
  
  uVar6 = 0xffffffff;
  if ((str != (char *)0x0) && (cVar1 = *str, cVar1 != '\0')) {
    sVar3 = strlen(str);
    pRVar5 = roles;
    __n = (size_t)(int)sVar3;
    pcVar4 = "Archeologist";
    uVar6 = 0;
    do {
      pRVar5 = pRVar5 + 1;
      iVar2 = strncasecmp(str,pcVar4,__n);
      if (iVar2 == 0) goto LAB_00235f56;
      pcVar4 = pRVar5[-1].name.f;
      if (pcVar4 != (char *)0x0) {
        iVar2 = strncasecmp(str,pcVar4,__n);
        if (iVar2 == 0) goto LAB_00235f56;
      }
      iVar2 = strncasecmp(str,pRVar5[-1].filecode,0xffffffffffffffff);
      if (iVar2 == 0) goto LAB_00235f56;
      uVar6 = uVar6 + 1;
      pcVar4 = (pRVar5->name).m;
    } while (uVar6 != 0xe);
    if ((int)sVar3 == 1) {
      uVar6 = 0xfffffffe;
      if ((cVar1 == '*') || (cVar1 == '@')) goto LAB_00235f56;
    }
    iVar2 = strncasecmp(str,"random",__n);
    uVar6 = (ulong)(-(uint)(iVar2 == 0) - 1);
  }
LAB_00235f56:
  return (int)uVar6;
}

Assistant:

int str2role(char *str)
{
	int i, len;

	/* Is str valid? */
	if (!str || !str[0])
	    return ROLE_NONE;

	/* Match as much of str as is provided */
	len = strlen(str);
	for (i = 0; roles[i].name.m; i++) {
	    /* Does it match the male name? */
	    if (!strncmpi(str, roles[i].name.m, len))
		return i;
	    /* Or the female name? */
	    if (roles[i].name.f && !strncmpi(str, roles[i].name.f, len))
		return i;
	    /* Or the filecode? */
	    if (!strcmpi(str, roles[i].filecode))
		return i;
	}

	if ((len == 1 && (*str == '*' || *str == '@')) ||
		!strncmpi(str, randomstr, len))
	    return ROLE_RANDOM;

	/* Couldn't find anything appropriate */
	return ROLE_NONE;
}